

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::ReadID(SQLexer *this)

{
  SQUnsignedInteger SVar1;
  int iVar2;
  ulong in_RAX;
  char *pcVar3;
  ulong uVar4;
  SQInteger SVar5;
  SQUnsignedInteger SVar6;
  ulong uVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  sqvector<char>::resize(&this->_longstr,0,(char *)((long)&uStack_38 + 7));
  uVar4 = (ulong)this->_currdata;
  do {
    SVar1 = (this->_longstr)._allocated;
    pcVar3 = (this->_longstr)._vals;
    uVar7 = (this->_longstr)._size;
    if (SVar1 <= uVar7) {
      SVar6 = uVar7 * 2;
      if (SVar6 == 0) {
        SVar6 = 4;
      }
      pcVar3 = (char *)sq_vm_realloc(pcVar3,SVar1,SVar6);
      (this->_longstr)._vals = pcVar3;
      (this->_longstr)._allocated = SVar6;
      uVar7 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar7 + 1;
    pcVar3[uVar7] = (char)uVar4;
    uVar4 = (*this->_readf)(this->_up);
    if ((long)uVar4 < 0x100) {
      if (uVar4 != 0) goto LAB_00151147;
      this->_currdata = '\0';
      this->_reached_eof = 1;
      uVar4 = 0;
    }
    else {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_00151147:
      this->_currdata = (LexChar)uVar4;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    iVar2 = isalnum((uint)uVar4 & 0xff);
    if (((char)uVar4 != '_') && (iVar2 == 0)) {
      SVar1 = (this->_longstr)._allocated;
      pcVar3 = (this->_longstr)._vals;
      uVar4 = (this->_longstr)._size;
      if (SVar1 <= uVar4) {
        SVar6 = 4;
        if (uVar4 * 2 != 0) {
          SVar6 = uVar4 * 2;
        }
        pcVar3 = (char *)sq_vm_realloc(pcVar3,SVar1,SVar6);
        (this->_longstr)._vals = pcVar3;
        (this->_longstr)._allocated = SVar6;
        uVar4 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar4 + 1;
      pcVar3[uVar4] = '\0';
      SVar5 = GetIDType(this,(this->_longstr)._vals,(this->_longstr)._size - 1);
      if ((SVar5 == 0x136) || (SVar5 == 0x102)) {
        this->_svalue = (this->_longstr)._vals;
      }
      return SVar5;
    }
  } while( true );
}

Assistant:

SQInteger SQLexer::ReadID()
{
    SQInteger res;
    INIT_TEMP_STRING();
    do {
        APPEND_CHAR(CUR_CHAR);
        NEXT();
    } while(scisalnum(CUR_CHAR) || CUR_CHAR == _SC('_'));
    TERMINATE_BUFFER();
    res = GetIDType(&_longstr[0],_longstr.size() - 1);
    if(res == TK_IDENTIFIER || res == TK_CONSTRUCTOR) {
        _svalue = &_longstr[0];
    }
    return res;
}